

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport.c
# Opt level: O0

TRANSPORT_LL_HANDLE IoTHubTransport_GetLLTransport(TRANSPORT_HANDLE transportHandle)

{
  TRANSPORT_HANDLE_DATA *transportData;
  TRANSPORT_LL_HANDLE llTransport;
  TRANSPORT_HANDLE transportHandle_local;
  
  if (transportHandle == (TRANSPORT_HANDLE)0x0) {
    transportData = (TRANSPORT_HANDLE_DATA *)0x0;
  }
  else {
    transportData = (TRANSPORT_HANDLE_DATA *)transportHandle->transportLLHandle;
  }
  return transportData;
}

Assistant:

TRANSPORT_LL_HANDLE IoTHubTransport_GetLLTransport(TRANSPORT_HANDLE transportHandle)
{
    TRANSPORT_LL_HANDLE llTransport;
    if (transportHandle == NULL)
    {
        llTransport = NULL;
    }
    else
    {
        TRANSPORT_HANDLE_DATA * transportData = (TRANSPORT_HANDLE_DATA*)transportHandle;
        llTransport = transportData->transportLLHandle;
    }
    return llTransport;
}